

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQ<GMM_TILE_MODE_ENUM,GMM_TILE_MODE_ENUM>
          (internal *this,char *expected_expression,char *actual_expression,
          GMM_TILE_MODE_ENUM *expected,GMM_TILE_MODE_ENUM *actual)

{
  GMM_TILE_MODE_ENUM *pGVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar3;
  GMM_TILE_MODE_ENUM *actual_local;
  GMM_TILE_MODE_ENUM *expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  string local_50;
  string local_30;
  long local_10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*expected == *actual) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    pGVar1 = actual;
    FormatForComparisonFailureMessage<GMM_TILE_MODE_ENUM,GMM_TILE_MODE_ENUM>
              (&local_30,(internal *)expected,actual,actual);
    FormatForComparisonFailureMessage<GMM_TILE_MODE_ENUM,GMM_TILE_MODE_ENUM>
              (&local_50,(internal *)actual,expected,pGVar1);
    EqFailure(this,expected_expression,actual_expression,&local_30,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    sVar2.ptr_ = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    AVar3.message_.ptr_ = sVar2.ptr_;
    AVar3._0_8_ = this;
    return AVar3;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                const char* actual_expression,
                const T1& expected,
                const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                // signed/unsigned mismatch.
#endif

                if (expected == actual) {
                    return AssertionSuccess();
                }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

                return EqFailure(expected_expression,
                    actual_expression,
                    FormatForComparisonFailureMessage(expected, actual),
                    FormatForComparisonFailureMessage(actual, expected),
                    false);
            }